

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASBuilderGetBuildPropertiesExp
          (ze_rtas_builder_exp_handle_t hBuilder,
          ze_rtas_builder_build_op_exp_desc_t *pBuildOpDescriptor,
          ze_rtas_builder_exp_properties_t *pProperties)

{
  ze_pfnRTASBuilderGetBuildPropertiesExp_t pfnGetBuildPropertiesExp;
  ze_result_t result;
  ze_rtas_builder_exp_properties_t *pProperties_local;
  ze_rtas_builder_build_op_exp_desc_t *pBuildOpDescriptor_local;
  ze_rtas_builder_exp_handle_t hBuilder_local;
  
  pfnGetBuildPropertiesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c168 != (code *)0x0) {
    pfnGetBuildPropertiesExp._4_4_ = (*DAT_0011c168)(hBuilder,pBuildOpDescriptor,pProperties);
  }
  return pfnGetBuildPropertiesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderGetBuildPropertiesExp(
        ze_rtas_builder_exp_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_exp_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        ze_rtas_builder_exp_properties_t* pProperties   ///< [in,out] query result for builder properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBuildPropertiesExp = context.zeDdiTable.RTASBuilderExp.pfnGetBuildPropertiesExp;
        if( nullptr != pfnGetBuildPropertiesExp )
        {
            result = pfnGetBuildPropertiesExp( hBuilder, pBuildOpDescriptor, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }